

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

Type wasm::Type::getLeastUpperBound(Type a,Type b)

{
  bool bVar1;
  Exactness exact;
  size_t __n;
  size_t sVar2;
  Type *pTVar3;
  Type TVar4;
  HeapType a_00;
  HeapType b_00;
  uint uVar5;
  Nullability nullable;
  optional<wasm::HeapType> oVar6;
  Type local_80;
  Type lub;
  undefined1 auStack_68 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> elems;
  Type local_48;
  Type a_local;
  Type b_local;
  
  if (a.id == b.id) {
    return (Type)a.id;
  }
  if (a.id == 1) {
    return (Type)b.id;
  }
  if (b.id == 1) {
    return (Type)a.id;
  }
  local_48.id = a.id;
  a_local = b;
  if (((a.id & 1) != 0 && 6 < a.id) && ((b.id & 1) != 0 && 6 < b.id)) {
    __n = size(&local_48);
    sVar2 = size(&a_local);
    if (__n != sVar2) {
      return (Type)0;
    }
    auStack_68 = (undefined1  [8])0x0;
    elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_68,__n);
    if (__n != 0) {
      sVar2 = 0;
      do {
        lub.id = (uintptr_t)&local_48;
        pTVar3 = Iterator::operator*((Iterator *)&lub);
        TVar4.id = pTVar3->id;
        lub.id = (uintptr_t)&a_local;
        pTVar3 = Iterator::operator*((Iterator *)&lub);
        TVar4 = getLeastUpperBound(TVar4,pTVar3->id);
        local_80 = TVar4;
        if (TVar4.id == 0) {
          b_local.id = 0;
        }
        else if (elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_68,
                     (iterator)
                     elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_80);
        }
        else {
          (elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = (uintptr_t)TVar4;
          elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        if (TVar4.id == 0) goto LAB_00cc0408;
        sVar2 = sVar2 + 1;
      } while (__n != sVar2);
    }
    Type(&b_local,(Tuple *)auStack_68);
LAB_00cc0408:
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,
                      (long)elems.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
      return (Type)b_local.id;
    }
    return (Type)b_local.id;
  }
  if ((a.id & 1) != 0 || a.id < 7) {
    return (Type)0;
  }
  if ((b.id & 1) != 0 || b.id < 7) {
    return (Type)0;
  }
  a_00 = getHeapType(&local_48);
  b_00 = getHeapType(&a_local);
  oVar6 = HeapType::getLeastUpperBound(a_00,b_00);
  if (((undefined1  [16])
       oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    return (Type)0;
  }
  nullable = Nullable;
  if (local_48.id < 7 || ((uint)local_48.id & 3) != 2) {
    nullable = (Nullability)(((uint)a_local.id & 3) == 2 && 6 < a_local.id);
  }
  if ((a_00.id < 0x7d) && (uVar5 = (uint)a_00.id & 0x7b, (uVar5 << 0x1d | uVar5 - 8 >> 3) - 10 < 5))
  {
    pTVar3 = &a_local;
  }
  else {
    if ((0x7c < b_00.id) ||
       (uVar5 = (uint)b_00.id & 0x7b, 4 < (uVar5 << 0x1d | uVar5 - 8 >> 3) - 10)) {
      if ((((local_48.id & 1) == 0 && 6 < local_48.id) && (bVar1 = isExact(&local_48), !bVar1)) ||
         (((a_local.id & 1) == 0 && 6 < a_local.id && (bVar1 = isExact(&a_local), !bVar1)))) {
        exact = Inexact;
      }
      else {
        exact = (Exactness)(a_00.id == b_00.id);
      }
      goto LAB_00cc0544;
    }
    pTVar3 = &local_48;
  }
  exact = getExactness(pTVar3);
LAB_00cc0544:
  Type(&b_local,oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload._M_value,nullable,exact);
  if (((undefined1  [16])
       oVar6.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    return (Type)0;
  }
  return (Type)b_local.id;
}

Assistant:

Type Type::getLeastUpperBound(Type a, Type b) {
  if (a == b) {
    return a;
  }
  if (a == Type::unreachable) {
    return b;
  }
  if (b == Type::unreachable) {
    return a;
  }
  if (a.isTuple() && b.isTuple()) {
    auto size = a.size();
    if (size != b.size()) {
      return Type::none;
    }
    std::vector<Type> elems;
    elems.reserve(size);
    for (size_t i = 0; i < size; ++i) {
      auto lub = Type::getLeastUpperBound(a[i], b[i]);
      if (lub == Type::none) {
        return Type::none;
      }
      elems.push_back(lub);
    }
    return Type(elems);
  }
  if (a.isRef() && b.isRef()) {
    auto heapTypeA = a.getHeapType();
    auto heapTypeB = b.getHeapType();
    if (auto heapType = HeapType::getLeastUpperBound(heapTypeA, heapTypeB)) {
      auto nullability =
        (a.isNullable() || b.isNullable()) ? Nullable : NonNullable;
      // If one heap type is bottom, then the exactness comes from the other
      // heap type. Otherwise, the LUB can only be exact if both of the inputs
      // are the same exact heap type.
      auto exactness = heapTypeA.isBottom()               ? b.getExactness()
                       : heapTypeB.isBottom()             ? a.getExactness()
                       : (a.isInexact() || b.isInexact()) ? Inexact
                       : (heapTypeA != heapTypeB)         ? Inexact
                                                          : Exact;
      return Type(*heapType, nullability, exactness);
    }
  }
  return Type::none;
  WASM_UNREACHABLE("unexpected type");
}